

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O3

OpenMPClause *
OpenMPIfClause::addIfClause
          (OpenMPDirective *directive,OpenMPIfClauseModifier modifier,char *user_defined_modifier)

{
  long lVar1;
  char *pcVar2;
  iterator __position;
  OpenMPIfClauseModifier OVar3;
  ulong uVar4;
  long *plVar5;
  ulong uVar6;
  int iVar7;
  mapped_type *ppvVar8;
  size_t sVar9;
  OpenMPIfClause *pOVar10;
  vector<OpenMPClause*,std::allocator<OpenMPClause*>> *pvVar11;
  ulong __n;
  long *plVar12;
  bool bVar13;
  OpenMPClause *new_clause;
  string current_user_defined_modifier_expression;
  OpenMPIfClause *local_90;
  OpenMPIfClauseModifier local_84;
  undefined1 *local_80;
  ulong local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  long *local_60;
  ulong local_58;
  long local_50 [2];
  char *local_40;
  OpenMPIfClause *local_38;
  
  local_80 = (undefined1 *)((ulong)local_80 & 0xffffffff00000000);
  ppvVar8 = std::
            map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
            ::operator[](&directive->clauses,(key_type *)&local_80);
  pvVar11 = (vector<OpenMPClause*,std::allocator<OpenMPClause*>> *)*ppvVar8;
  local_90 = (OpenMPIfClause *)0x0;
  plVar12 = *(long **)pvVar11;
  local_84 = modifier;
  local_40 = user_defined_modifier;
  if (*(long **)(pvVar11 + 8) == plVar12) {
    pOVar10 = (OpenMPIfClause *)operator_new(0x90);
    OpenMPIfClause(pOVar10,modifier);
    local_90 = pOVar10;
    if (modifier == OMPC_IF_MODIFIER_user) {
      pcVar2 = (char *)(pOVar10->user_defined_modifier)._M_string_length;
      strlen(user_defined_modifier);
      std::__cxx11::string::_M_replace
                ((ulong)&pOVar10->user_defined_modifier,0,pcVar2,(ulong)user_defined_modifier);
    }
    pvVar11 = (vector<OpenMPClause*,std::allocator<OpenMPClause*>> *)operator_new(0x18);
    *(undefined8 *)pvVar11 = 0;
    *(undefined8 *)(pvVar11 + 8) = 0;
    *(undefined8 *)(pvVar11 + 0x10) = 0;
    std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>::_M_realloc_insert<OpenMPClause*const&>
              (pvVar11,(iterator)0x0,(OpenMPClause **)&local_90);
    local_80 = (undefined1 *)((ulong)local_80 & 0xffffffff00000000);
    ppvVar8 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[](&directive->clauses,(key_type *)&local_80);
    *ppvVar8 = (mapped_type)pvVar11;
  }
  else {
    do {
      local_80 = &local_70;
      local_78 = 0;
      local_70 = 0;
      if (user_defined_modifier != (char *)0x0) {
        local_60 = local_50;
        sVar9 = strlen(user_defined_modifier);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,user_defined_modifier,user_defined_modifier + sVar9);
        std::__cxx11::string::operator=((string *)&local_80,(string *)&local_60);
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
      }
      lVar1 = *plVar12;
      if (*(OpenMPIfClauseModifier *)(lVar1 + 0x68) == local_84) {
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,*(long *)(lVar1 + 0x70),
                   *(long *)(lVar1 + 0x78) + *(long *)(lVar1 + 0x70));
        uVar6 = local_58;
        plVar5 = local_60;
        uVar4 = local_78;
        __n = local_78;
        if (local_58 < local_78) {
          __n = local_58;
        }
        if ((__n == 0) || (iVar7 = bcmp(local_80,local_60,__n), iVar7 == 0)) {
          bVar13 = uVar4 == uVar6;
        }
        else {
          bVar13 = false;
        }
        if (plVar5 != local_50) {
          operator_delete(plVar5,local_50[0] + 1);
        }
        user_defined_modifier = local_40;
        if (bVar13) {
          local_90 = (OpenMPIfClause *)*plVar12;
          local_38 = local_90;
        }
      }
      else {
        bVar13 = false;
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
      }
      if (bVar13) {
        return &local_38->super_OpenMPClause;
      }
      plVar12 = plVar12 + 1;
    } while (plVar12 != *(long **)(pvVar11 + 8));
    pOVar10 = (OpenMPIfClause *)operator_new(0x90);
    OVar3 = local_84;
    OpenMPIfClause(pOVar10,local_84);
    local_90 = pOVar10;
    if (OVar3 == OMPC_IF_MODIFIER_user) {
      pcVar2 = (char *)(pOVar10->user_defined_modifier)._M_string_length;
      strlen(user_defined_modifier);
      std::__cxx11::string::_M_replace
                ((ulong)&pOVar10->user_defined_modifier,0,pcVar2,(ulong)user_defined_modifier);
    }
    __position._M_current = *(OpenMPClause ***)(pvVar11 + 8);
    if (__position._M_current == *(OpenMPClause ***)(pvVar11 + 0x10)) {
      std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>::
      _M_realloc_insert<OpenMPClause*const&>(pvVar11,__position,(OpenMPClause **)&local_90);
    }
    else {
      *__position._M_current = &local_90->super_OpenMPClause;
      *(long *)(pvVar11 + 8) = *(long *)(pvVar11 + 8) + 8;
    }
  }
  return &local_90->super_OpenMPClause;
}

Assistant:

OpenMPClause* OpenMPIfClause::addIfClause(OpenMPDirective *directive, OpenMPIfClauseModifier modifier, char * user_defined_modifier) {

    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_if);
    OpenMPClause* new_clause = NULL;

    if (current_clauses->size() == 0) {
        new_clause = new OpenMPIfClause(modifier);
        if (modifier == OMPC_IF_MODIFIER_user) {
            ((OpenMPIfClause*)new_clause)->setUserDefinedModifier(user_defined_modifier);
        };
        current_clauses = new std::vector<OpenMPClause*>();
        current_clauses->push_back(new_clause);
        (*all_clauses)[OMPC_if] = current_clauses;
    } else {
        for (std::vector<OpenMPClause*>::iterator it = current_clauses->begin(); it != current_clauses->end(); ++it) {
            std::string current_user_defined_modifier_expression;
            if (user_defined_modifier) {
                current_user_defined_modifier_expression = std::string(user_defined_modifier);
            };
            if (((OpenMPIfClause*)(*it))->getModifier() == modifier &&
                current_user_defined_modifier_expression.compare(((OpenMPIfClause*)(*it))->getUserDefinedModifier()) == 0) {
                new_clause = (*it);
                return new_clause;
            };
        };
        new_clause = new OpenMPIfClause(modifier);
        if (modifier == OMPC_IF_MODIFIER_user) {
            ((OpenMPIfClause*)new_clause)->setUserDefinedModifier(user_defined_modifier);
        }
        current_clauses->push_back(new_clause);
    }
    return new_clause;
}